

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

CTxDestination *
AddAndGetMultisigDestination
          (CTxDestination *__return_storage_ptr__,int required,
          vector<CPubKey,_std::allocator<CPubKey>_> *pubkeys,OutputType type,
          FlatSigningProvider *keystore,CScript *script_out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  UniValue *pUVar4;
  pointer pCVar5;
  FlatSigningProvider *args_1;
  vector<CPubKey,_std::allocator<CPubKey>_> *__range1;
  long in_FS_OFFSET;
  long local_68;
  int local_5c;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_5c = required;
  if (required < 1) {
    pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
    local_58._0_8_ = local_58 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"a multisignature address must require at least one key to redeem"
               ,"");
    JSONRPCError(pUVar4,-8,(string *)local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    uVar3 = ((long)(pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                  super__Vector_impl_data._M_start) * 0xfc0fc0fc0fc0fc1;
    if ((int)uVar3 < required) {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      local_68 = ((long)(pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                       super__Vector_impl_data._M_start) * 0xfc0fc0fc0fc0fc1;
      tinyformat::format<unsigned_long,int>
                ((string *)local_58,
                 (tinyformat *)
                 "not enough keys supplied (got %u keys, but need at least %d to redeem)",
                 (char *)&local_68,(unsigned_long *)&local_5c,(int *)keystore);
      JSONRPCError(pUVar4,-8,(string *)local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else if (uVar3 < 0x15) {
      args_1 = keystore;
      GetScriptForMultisig((CScript *)local_58,required,pubkeys);
      if (0x1c < (script_out->super_CScriptBase)._size) {
        free((script_out->super_CScriptBase)._union.indirect_contents.indirect);
      }
      *(undefined4 *)((long)&(script_out->super_CScriptBase)._union + 0xc) = local_58._12_4_;
      *(undefined4 *)((long)&(script_out->super_CScriptBase)._union + 0x10) = local_58._16_4_;
      *(undefined4 *)((long)&(script_out->super_CScriptBase)._union + 0x14) = local_58._20_4_;
      *(undefined4 *)((long)&(script_out->super_CScriptBase)._union + 0x18) = local_58._24_4_;
      *(undefined4 *)&(script_out->super_CScriptBase)._union = local_58._0_4_;
      *(undefined4 *)((long)&(script_out->super_CScriptBase)._union + 4) = local_58._4_4_;
      (script_out->super_CScriptBase)._union.indirect_contents.capacity = local_58._8_4_;
      *(undefined4 *)((long)&(script_out->super_CScriptBase)._union + 0xc) = local_58._12_4_;
      (script_out->super_CScriptBase)._size = local_58._28_4_;
      for (pCVar5 = (pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar5 != (pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                    super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
        if ((pCVar5->vch[0] & 0xfe) != 2) {
          type = LEGACY;
          break;
        }
      }
      if ((uint)local_58._28_4_ < 0x226 || type != LEGACY) {
        AddAndGetDestinationForScript(__return_storage_ptr__,keystore,script_out,type);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
      }
      else {
        pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
        uVar1 = (script_out->super_CScriptBase)._size;
        uVar2 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar2 = uVar1;
        }
        local_68 = CONCAT44(local_68._4_4_,uVar2);
        tinyformat::format<unsigned_int,unsigned_int>
                  ((string *)local_58,(tinyformat *)"redeemScript exceeds size limit: %d > %d",
                   (char *)&local_68,&MAX_SCRIPT_ELEMENT_SIZE,(uint *)args_1);
        JSONRPCError(pUVar4,-8,(string *)local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
    else {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<int>
                ((string *)local_58,
                 "Number of keys involved in the multisignature address creation > %d\nReduce the number"
                 ,&MAX_PUBKEYS_PER_MULTISIG);
      JSONRPCError(pUVar4,-8,(string *)local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

CTxDestination AddAndGetMultisigDestination(const int required, const std::vector<CPubKey>& pubkeys, OutputType type, FlatSigningProvider& keystore, CScript& script_out)
{
    // Gather public keys
    if (required < 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "a multisignature address must require at least one key to redeem");
    }
    if ((int)pubkeys.size() < required) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("not enough keys supplied (got %u keys, but need at least %d to redeem)", pubkeys.size(), required));
    }
    if (pubkeys.size() > MAX_PUBKEYS_PER_MULTISIG) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Number of keys involved in the multisignature address creation > %d\nReduce the number", MAX_PUBKEYS_PER_MULTISIG));
    }

    script_out = GetScriptForMultisig(required, pubkeys);

    // Check if any keys are uncompressed. If so, the type is legacy
    for (const CPubKey& pk : pubkeys) {
        if (!pk.IsCompressed()) {
            type = OutputType::LEGACY;
            break;
        }
    }

    if (type == OutputType::LEGACY && script_out.size() > MAX_SCRIPT_ELEMENT_SIZE) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, (strprintf("redeemScript exceeds size limit: %d > %d", script_out.size(), MAX_SCRIPT_ELEMENT_SIZE)));
    }

    // Make the address
    CTxDestination dest = AddAndGetDestinationForScript(keystore, script_out, type);

    return dest;
}